

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_out.cc
# Opt level: O2

void rcg::printNode(string *prefix,INode *node,int depth,bool show_enum_list)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  long *plVar7;
  ulong uVar8;
  gcstring *str;
  rcg *this;
  undefined8 *puVar9;
  INode *node_00;
  IInteger *pIVar10;
  long lVar11;
  int64_t value;
  rcg *p;
  IBase *pIVar12;
  size_t i;
  ulong uVar13;
  double dVar14;
  StringList_t list;
  FeatureList_t feature;
  
  if (node == (INode *)0x0) {
    return;
  }
  iVar2 = (*(code *)**(undefined8 **)(node + *(long *)(*(long *)node + -0x28)))
                    (node + *(long *)(*(long *)node + -0x28));
  if (iVar2 == 0) {
    return;
  }
  uVar3 = (**(code **)(*(long *)node + 0xf0))(node);
  switch(uVar3) {
  case 0:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Value: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0011bb1e;
  case 1:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Base: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0011bb1e;
  case 2:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Integer: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5," ");
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    value = -2;
    this = (rcg *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,&GenApi_3_4::IInteger::typeinfo);
    if (this == (rcg *)0x0) {
      p = (rcg *)0x0;
    }
    else {
      p = this + *(long *)(*(long *)this + -0x28);
    }
    bVar1 = GenApi_3_4::IsReadable((IBase *)p);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[");
      pIVar10 = (IInteger *)(**(code **)(*(long *)this + 0x60))(this);
      formatValue_abi_cxx11_((string *)&list,this,pIVar10,value);
      poVar5 = std::operator<<(poVar5,(string *)&list);
      poVar5 = std::operator<<(poVar5,", ");
      pIVar10 = (IInteger *)(**(code **)(*(long *)this + 0x68))(this);
      formatValue_abi_cxx11_((string *)&feature,this,pIVar10,value);
      poVar5 = std::operator<<(poVar5,(string *)&feature);
      std::operator<<(poVar5,"]: ");
      std::__cxx11::string::~string((string *)&feature);
      std::__cxx11::string::~string((string *)&list);
      pIVar10 = (IInteger *)(**(code **)(*(long *)this + 0x48))(this,0,0);
      formatValue_abi_cxx11_((string *)&feature,this,pIVar10,value);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&feature);
      poVar5 = std::operator<<(poVar5," ");
      (**(code **)(*(long *)this + 0x90))(&list,this);
      operator<<(poVar5,(gcstring *)&list);
      GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
      std::__cxx11::string::~string((string *)&feature);
    }
    break;
  case 3:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Boolean: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    std::operator<<(poVar5,pcVar6);
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    if (plVar7 == (long *)0x0) {
      pIVar12 = (IBase *)0x0;
    }
    else {
      pIVar12 = (IBase *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
    }
    bVar1 = GenApi_3_4::IsReadable(pIVar12);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,": ");
      (**(code **)(*plVar7 + 0x48))(plVar7,0,0);
      std::ostream::_M_insert<bool>(SUB81(poVar5,0));
    }
    break;
  case 4:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Command: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0011bb1e;
  case 5:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Float: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5," ");
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,&GenApi_3_4::IFloat::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar7 == (long *)0x0) {
      pIVar12 = (IBase *)0x0;
    }
    else {
      pIVar12 = (IBase *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
    }
    bVar1 = GenApi_3_4::IsReadable(pIVar12);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"[");
      dVar14 = (double)(**(code **)(*plVar7 + 0x60))(plVar7);
      poVar5 = std::ostream::_M_insert<double>(dVar14);
      std::operator<<(poVar5,", ");
      dVar14 = (double)(**(code **)(*plVar7 + 0x68))(plVar7);
      poVar5 = std::ostream::_M_insert<double>(dVar14);
      std::operator<<(poVar5,"]: ");
      dVar14 = (double)(**(code **)(*plVar7 + 0x48))(plVar7,0,0);
      poVar5 = std::ostream::_M_insert<double>(dVar14);
      poVar5 = std::operator<<(poVar5," ");
      (**(code **)(*plVar7 + 0x98))(&list,plVar7);
      operator<<(poVar5,(gcstring *)&list);
LAB_0011bf55:
      GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    }
    break;
  case 6:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"String: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,": ");
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,&GenApi_3_4::IString::typeinfo
                                    ,0xfffffffffffffffe);
    if (plVar7 == (long *)0x0) {
      pIVar12 = (IBase *)0x0;
    }
    else {
      pIVar12 = (IBase *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
    }
    bVar1 = GenApi_3_4::IsReadable(pIVar12);
    if (bVar1) {
      (**(code **)(*plVar7 + 0x48))(&list,plVar7,0,0);
      operator<<((ostream *)&std::cout,(gcstring *)&list);
      goto LAB_0011bf55;
    }
    break;
  case 7:
    plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    if (plVar7 == (long *)0x0) {
      return;
    }
    iVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,0);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Register: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5,"[");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,"] ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,": ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    iVar4 = (*(code *)**(undefined8 **)((long)plVar7 + *(long *)(*plVar7 + -0x28)))
                      ((long)plVar7 + *(long *)(*plVar7 + -0x28));
    if (iVar4 - 3U < 2) {
      iVar4 = 0x20;
      if (iVar2 < 0x20) {
        iVar4 = iVar2;
      }
      (**(code **)(*plVar7 + 0x40))(plVar7,&list,(long)iVar4,0,0);
      for (uVar13 = 0; ((long)uVar13 < (long)iVar2 && (uVar13 < 0x20)); uVar13 = uVar13 + 1) {
        poVar5 = std::operator<<(&std::cout,0x30);
        *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
        std::ostream::operator<<((ostream *)poVar5,(uint)(byte)(&list)[uVar13]);
      }
      if (0x20 < iVar2) {
        std::operator<<((ostream *)&std::cout,"...");
      }
    }
    *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
         *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
         0xffffffb5 | 2;
    break;
  case 8:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Category: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    if (depth < 1) {
      return;
    }
    plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::ICategory::typeinfo,0xfffffffffffffffe);
    if (plVar7 == (long *)0x0) {
      return;
    }
    GenApi_3_4::value_vector::value_vector(&feature);
    (**(code **)(*plVar7 + 0x38))(plVar7,&feature);
    for (uVar13 = 0; uVar8 = GenApi_3_4::value_vector::size(), uVar13 < uVar8; uVar13 = uVar13 + 1)
    {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                     prefix,"  ");
      puVar9 = (undefined8 *)GenApi_3_4::value_vector::operator[]((ulong)&feature);
      node_00 = (INode *)(**(code **)(*(long *)*puVar9 + 0x18))();
      printNode((string *)&list,node_00,depth + -1,show_enum_list);
      std::__cxx11::string::~string((string *)&list);
    }
    GenApi_3_4::value_vector::~value_vector(&feature);
    return;
  case 9:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Enumeration: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,' ');
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
    plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    if (plVar7 != (long *)0x0) {
      std::operator<<((ostream *)&std::cout,'[');
      if (show_enum_list) {
        GenICam_3_4::gcstring_vector::gcstring_vector(&list);
        (**(code **)(*plVar7 + 0x38))(plVar7,&list);
        for (uVar13 = 0; uVar8 = GenICam_3_4::gcstring_vector::size(), uVar13 < uVar8;
            uVar13 = uVar13 + 1) {
          if (uVar13 != 0) {
            std::operator<<((ostream *)&std::cout,' ');
          }
          str = (gcstring *)GenICam_3_4::gcstring_vector::operator[]((ulong)&list);
          operator<<((ostream *)&std::cout,str);
        }
        GenICam_3_4::gcstring_vector::~gcstring_vector(&list);
      }
      else {
        std::operator<<((ostream *)&std::cout,"...");
      }
      std::operator<<((ostream *)&std::cout,"]: ");
      iVar2 = (*(code *)**(undefined8 **)((long)plVar7 + *(long *)(*plVar7 + -0x28)))
                        ((long)plVar7 + *(long *)(*plVar7 + -0x28));
      if ((iVar2 - 3U < 2) && (lVar11 = (**(code **)(*plVar7 + 0x78))(plVar7,0,0), lVar11 != 0)) {
        plVar7 = (long *)(**(code **)(*plVar7 + 0x78))(plVar7,0,0);
        (**(code **)(*plVar7 + 0x40))(&list,plVar7);
        operator<<((ostream *)&std::cout,(gcstring *)&list);
        goto LAB_0011bf55;
      }
    }
    break;
  case 10:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"EnumEntry: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0011bb1e;
  case 0xb:
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)prefix);
    poVar5 = std::operator<<(poVar5,"Port: ");
    (**(code **)(*(long *)node + 0x18))(&list,node,0);
    poVar5 = operator<<(poVar5,(gcstring *)&list);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = anon_unknown_2::getAccessMode(node);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_0011bb1e:
    GenICam_3_4::gcstring::~gcstring((gcstring *)&list);
  default:
    goto switchD_0011b3cf_default;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
switchD_0011b3cf_default:
  return;
}

Assistant:

void printNode(const std::string &prefix, GenApi::INode *node, int depth, bool show_enum_list)
{
  if (node != 0 && node->GetAccessMode() != GenApi::NI)
  {
    switch (node->GetPrincipalInterfaceType())
    {
      case GenApi::intfIValue:
        std::cout << prefix << "Value: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIBase:
        std::cout << prefix << "Base: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIInteger:
        {
          std::cout << prefix << "Integer: " << node->GetName() << " "
                    << getAccessMode(node) << " ";

          GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << "[" << formatValue(p, p->GetMin()) << ", "
                      << formatValue(p, p->GetMax()) << "]: ";
            std::cout << formatValue(p, p->GetValue()) << " " << p->GetUnit();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIBoolean:
        {
          std::cout << prefix << "Boolean: " << node->GetName() << " " << getAccessMode(node);

          GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << ": " << p->GetValue();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfICommand:
        std::cout << prefix << "Command: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIFloat:
        {
          std::cout << prefix << "Float: " << node->GetName() << " " << getAccessMode(node)
                    << " ";

          GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << "[" << p->GetMin() << ", "
                      << p->GetMax() << "]: "
                      << p->GetValue() << " " << p->GetUnit();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIString:
        {
          std::cout << prefix << "String: " << node->GetName() << " " << getAccessMode(node)
                    << ": ";

          GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << p->GetValue();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIRegister:
        {
          GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

          if (p)
          {
            int len=static_cast<int>(p->GetLength());

            std::cout << prefix << "Register: " << node->GetName() << "[" << len << "] "
              << getAccessMode(node) << ": " << std::hex;

            if (GenApi::IsReadable(p))
            {
              uint8_t buffer[32];
              p->Get(buffer, std::min(len, 32));

              for (int i=0; i<len && i<32; i++)
              {
                std::cout << std::setfill('0') << std::setw(2) << static_cast<int>(buffer[i]);
              }

              if (len > 32)
              {
                std::cout << "...";
              }
            }

            std::cout << std::dec << std::endl;
          }
        }

        break;

      case GenApi::intfICategory:
        {
          std::cout << prefix << "Category: " << node->GetName() << " "
                    << getAccessMode(node) << std::endl;

          if (depth > 0)
          {
            GenApi::ICategory *root=dynamic_cast<GenApi::ICategory *>(node);

            if (root != 0)
            {
              GenApi::FeatureList_t feature;
              root->GetFeatures(feature);

              for (size_t i=0; i<feature.size(); i++)
              {
                printNode(prefix+"  ", feature[i]->GetNode(), depth-1, show_enum_list);
              }
            }
          }
        }
        break;

      case GenApi::intfIEnumeration:
        {
          std::cout << prefix << "Enumeration: " << node->GetName() << " " << getAccessMode(node)
                    << ' ';

          GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);

          if (p != nullptr)
          {
            std::cout << '[';

            if (show_enum_list)
            {
              GenApi::StringList_t list;
              p->GetSymbolics(list);

              for (size_t i=0; i<list.size(); i++)
              {
                if (i > 0)
                {
                  std::cout << ' ';
                }

                std::cout << list[i];
              }
            }
            else
            {
              std::cout << "...";
            }

            std::cout << "]: ";

            if (GenApi::IsReadable(p->GetAccessMode()) && p->GetCurrentEntry() != 0)
            {
              std::cout << p->GetCurrentEntry()->GetSymbolic();
            }
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIEnumEntry:
        std::cout << prefix << "EnumEntry: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIPort:
        std::cout << prefix << "Port: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      default:
        break;
    }
  }
}